

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclUnsizedArrays2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclUnsizedArrays2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  TestError *this_00;
  string shader_source;
  string input [1];
  
  input[0]._M_dataplus._M_p = (pointer)&input[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)input,"    float [] x = float[](1), y;\n\n","");
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  shader_source._M_string_length = 0;
  shader_source.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_append((char *)&shader_source,shader_start_abi_cxx11_);
  std::__cxx11::string::_M_append((char *)&shader_source,(ulong)input[0]._M_dataplus._M_p);
  switch((ulong)tested_shader_type) {
  case 0:
  case 2:
  case 5:
    goto switchD_00b4ae6a_caseD_0;
  case 1:
    std::__cxx11::string::append((char *)&shader_source);
    goto switchD_00b4ae6a_caseD_0;
  case 3:
    puVar1 = &emit_quad_abi_cxx11_;
    break;
  case 4:
    puVar1 = &set_tesseation_abi_cxx11_;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0xa3a);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::_M_append((char *)&shader_source,*puVar1);
switchD_00b4ae6a_caseD_0:
  std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
  (*(code *)(&DAT_01aca5f4 + *(int *)(&DAT_01aca5f4 + (ulong)tested_shader_type * 4)))();
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclUnsizedArrays2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string input[] = { "    float [] x = float[](1), y;\n\n" };

	for (size_t string_index = 0; string_index < sizeof(input) / sizeof(input[0]); string_index++)
	{
		std::string shader_source;

		shader_source += shader_start;
		shader_source += input[string_index];

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_SHADER_TEST(API::ALLOW_UNSIZED_DECLARATION, tested_shader_type, shader_source);
	} /* for (int string_index = 0; ...) */
}